

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogStream.h
# Opt level: O0

void __thiscall Assimp::FileLogStream::FileLogStream(FileLogStream *this,char *file,IOSystem *io)

{
  IOStream *pIVar1;
  undefined1 local_40 [8];
  DefaultIOSystem FileSystem;
  IOSystem *io_local;
  char *file_local;
  FileLogStream *this_local;
  
  FileSystem.super_IOSystem.m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)io;
  LogStream::LogStream(&this->super_LogStream);
  (this->super_LogStream)._vptr_LogStream = (_func_int **)&PTR__FileLogStream_010409f0;
  this->m_pStream = (IOStream *)0x0;
  if ((file != (char *)0x0) && (*file != '\0')) {
    if (FileSystem.super_IOSystem.m_pathStack.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      DefaultIOSystem::DefaultIOSystem((DefaultIOSystem *)local_40);
      pIVar1 = DefaultIOSystem::Open((DefaultIOSystem *)local_40,file,"wt");
      this->m_pStream = pIVar1;
      DefaultIOSystem::~DefaultIOSystem((DefaultIOSystem *)local_40);
    }
    else {
      pIVar1 = (IOStream *)
               (**(code **)(*(long *)FileSystem.super_IOSystem.m_pathStack.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x20))
                         (FileSystem.super_IOSystem.m_pathStack.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,file,"wt");
      this->m_pStream = pIVar1;
    }
  }
  return;
}

Assistant:

inline FileLogStream::FileLogStream( const char* file, IOSystem* io ) :
    m_pStream(NULL)
{
    if ( !file || 0 == *file )
        return;

    // If no IOSystem is specified: take a default one
    if (!io)
    {
        DefaultIOSystem FileSystem;
        m_pStream = FileSystem.Open( file, "wt");
    }
    else m_pStream = io->Open( file, "wt" );
}